

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::ParameterErrorsTest::iterate(ParameterErrorsTest *this)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ContextType ctxType;
  deUint32 dVar9;
  undefined4 extraout_var;
  char *description;
  ulong uVar11;
  byte bVar12;
  qpTestResult testResult;
  ErrorsUtilities *pEVar13;
  TestContext *this_00;
  uint uVar14;
  GLuint texture_buffer;
  GLuint texture_2D;
  GLint storei [4];
  GLuint storeu [4];
  GLfloat storef [4];
  uint local_78;
  byte local_73;
  byte local_72;
  byte local_71;
  byte local_70;
  byte local_6f;
  byte local_6e;
  byte local_6d;
  uint local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long lVar10;
  
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar8);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar2) || (bVar3)) {
    local_6c = 0;
    local_78 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    (**(code **)(lVar10 + 0x400))(0xde1,1);
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x331e);
    (**(code **)(lVar10 + 0x400))(0x8c2a,1,&local_78);
    dVar9 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar9,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x3322);
    uVar14 = 0;
    do {
      uVar14 = uVar14 + 1;
      cVar4 = (**(code **)(lVar10 + 0xcc8))(uVar14);
    } while (cVar4 != '\0');
    iVar8 = 0;
    do {
      do {
        iVar8 = iVar8 + 1;
      } while (iVar8 == 0x90c7);
      uVar1 = 0;
      do {
        uVar11 = uVar1;
        if (uVar11 == 0x1c) break;
        uVar1 = uVar11 + 1;
      } while ((&DAT_01ac90a4)[uVar11] != iVar8);
    } while (uVar11 < 0x1c);
    pEVar13 = (ErrorsUtilities *)(ulong)local_6c;
    (**(code **)(lVar10 + 0xb00))(pEVar13,iVar8,&local_48);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar13,(this->super_TestCase).m_context,0x500,"glGetTextureParameterfv",
                       "pname is not an accepted value.");
    pEVar13 = (ErrorsUtilities *)(ulong)local_6c;
    (**(code **)(lVar10 + 0xaf0))(pEVar13,iVar8,&local_68);
    local_6d = ErrorsUtilities::CheckErrorAndLog
                         (pEVar13,(this->super_TestCase).m_context,0x500,"glGetTextureParameterIiv",
                          "pname is not an accepted value.");
    pEVar13 = (ErrorsUtilities *)(ulong)local_6c;
    (**(code **)(lVar10 + 0xaf8))(pEVar13,iVar8,&local_58);
    local_6e = ErrorsUtilities::CheckErrorAndLog
                         (pEVar13,(this->super_TestCase).m_context,0x500,"glGetTextureParameterIuiv"
                          ,"pname is not an accepted value.");
    pEVar13 = (ErrorsUtilities *)(ulong)local_6c;
    (**(code **)(lVar10 + 0xb08))(pEVar13,iVar8,&local_68);
    local_6f = ErrorsUtilities::CheckErrorAndLog
                         (pEVar13,(this->super_TestCase).m_context,0x500,"glGetTextureParameteriv",
                          "pname is not an accepted value.");
    pEVar13 = (ErrorsUtilities *)(ulong)uVar14;
    (**(code **)(lVar10 + 0xb00))(pEVar13,0x1006,&local_48);
    local_70 = ErrorsUtilities::CheckErrorAndLog
                         (pEVar13,(this->super_TestCase).m_context,0x502,"glGetTextureParameterfv",
                          "texture is not the name of an existing texture object.");
    pEVar13 = (ErrorsUtilities *)(ulong)uVar14;
    (**(code **)(lVar10 + 0xaf0))(pEVar13,0x1006,&local_68);
    local_71 = ErrorsUtilities::CheckErrorAndLog
                         (pEVar13,(this->super_TestCase).m_context,0x502,"glGetTextureParameterIiv",
                          "texture is not the name of an existing texture object.");
    pEVar13 = (ErrorsUtilities *)(ulong)uVar14;
    (**(code **)(lVar10 + 0xaf8))(pEVar13,0x1006,&local_58);
    local_72 = ErrorsUtilities::CheckErrorAndLog
                         (pEVar13,(this->super_TestCase).m_context,0x502,"glGetTextureParameterIuiv"
                          ,"texture is not the name of an existing texture object.");
    pEVar13 = (ErrorsUtilities *)(ulong)uVar14;
    (**(code **)(lVar10 + 0xb08))(pEVar13,0x1006,&local_68);
    local_73 = ErrorsUtilities::CheckErrorAndLog
                         (pEVar13,(this->super_TestCase).m_context,0x502,"glGetTextureParameteriv",
                          "texture is not the name of an existing texture object.");
    pEVar13 = (ErrorsUtilities *)(ulong)local_78;
    (**(code **)(lVar10 + 0xb00))(pEVar13,0x1006,&local_48);
    bVar3 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar13,(this->super_TestCase).m_context,0x500,"glGetTextureParameterfv",
                       "the effective target is not one of the supported texture targets (eg. TEXTURE_BUFFER)."
                      );
    pEVar13 = (ErrorsUtilities *)(ulong)local_78;
    (**(code **)(lVar10 + 0xaf0))(pEVar13,0x1006,&local_68);
    bVar5 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar13,(this->super_TestCase).m_context,0x500,"glGetTextureParameterIiv",
                       "the effective target is not one of the supported texture targets (eg. TEXTURE_BUFFER)."
                      );
    pEVar13 = (ErrorsUtilities *)(ulong)local_78;
    (**(code **)(lVar10 + 0xaf8))(pEVar13,0x1006,&local_58);
    bVar6 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar13,(this->super_TestCase).m_context,0x500,"glGetTextureParameterIuiv",
                       "the effective target is not one of the supported texture targets (eg. TEXTURE_BUFFER)."
                      );
    pEVar13 = (ErrorsUtilities *)(ulong)local_78;
    (**(code **)(lVar10 + 0xb08))(pEVar13,0x1006,&local_68);
    bVar7 = ErrorsUtilities::CheckErrorAndLog
                      (pEVar13,(this->super_TestCase).m_context,0x500,"glGetTextureParameteriv",
                       "the effective target is not one of the supported texture targets (eg. TEXTURE_BUFFER)."
                      );
    bVar12 = bVar2 & local_6d & local_6e & local_6f & local_70 & local_71 & local_72 & local_73;
    if (local_6c != 0) {
      (**(code **)(lVar10 + 0x480))(1);
    }
    if (local_78 != 0) {
      (**(code **)(lVar10 + 0x480))(1);
    }
    do {
      iVar8 = (**(code **)(lVar10 + 0x800))();
    } while (iVar8 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if ((bVar12 & bVar3 & bVar5 & bVar6 & bVar7) == 0) {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ParameterErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Objects. */
	glw::GLuint texture_2D		= 0;
	glw::GLuint texture_buffer  = 0;
	glw::GLuint texture_invalid = 0;
	glw::GLenum pname_invalid   = 0;

	glw::GLfloat storef[4] = {};
	glw::GLint   storei[4] = {};
	glw::GLuint  storeu[4] = {};

	try
	{
		/* Preparations. */

		/* 2D texture */
		gl.createTextures(GL_TEXTURE_2D, 1, &texture_2D);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		/* Buffer texture */
		gl.createTextures(GL_TEXTURE_BUFFER, 1, &texture_buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		/* invalid texture */
		while (gl.isTexture(++texture_invalid))
			;

		/* invalid pname */
		glw::GLenum all_pnames[] = { GL_IMAGE_FORMAT_COMPATIBILITY_TYPE,
									 GL_TEXTURE_IMMUTABLE_FORMAT,
									 GL_TEXTURE_IMMUTABLE_LEVELS,
									 GL_TEXTURE_TARGET,
									 GL_TEXTURE_VIEW_MIN_LEVEL,
									 GL_TEXTURE_VIEW_NUM_LEVELS,
									 GL_TEXTURE_VIEW_MIN_LAYER,
									 GL_TEXTURE_VIEW_NUM_LAYERS,
									 GL_DEPTH_STENCIL_TEXTURE_MODE,
									 GL_DEPTH_COMPONENT,
									 GL_STENCIL_INDEX,
									 GL_TEXTURE_BASE_LEVEL,
									 GL_TEXTURE_BORDER_COLOR,
									 GL_TEXTURE_COMPARE_MODE,
									 GL_TEXTURE_COMPARE_FUNC,
									 GL_TEXTURE_LOD_BIAS,
									 GL_TEXTURE_MAG_FILTER,
									 GL_TEXTURE_MAX_LEVEL,
									 GL_TEXTURE_MAX_LOD,
									 GL_TEXTURE_MIN_FILTER,
									 GL_TEXTURE_MIN_LOD,
									 GL_TEXTURE_SWIZZLE_R,
									 GL_TEXTURE_SWIZZLE_G,
									 GL_TEXTURE_SWIZZLE_B,
									 GL_TEXTURE_SWIZZLE_A,
									 GL_TEXTURE_SWIZZLE_RGBA,
									 GL_TEXTURE_WRAP_S,
									 GL_TEXTURE_WRAP_T,
									 GL_TEXTURE_WRAP_R };

		glw::GLuint all_pnames_count = sizeof(all_pnames) / sizeof(all_pnames[0]);

		bool is_valid = true;

		while (is_valid)
		{
			is_valid = false;

			++pname_invalid;

			for (glw::GLuint i = 0; i < all_pnames_count; ++i)
			{
				if (all_pnames[i] == pname_invalid)
				{
					is_valid = true;

					break;
				}
			}
		}

		/* Tests. */

		/* Check that INVALID_ENUM is generated by glGetTextureParameter* if pname
		 is not an accepted value. */
		gl.getTextureParameterfv(texture_2D, pname_invalid, storef);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glGetTextureParameterfv", "pname is not an accepted value.");

		gl.getTextureParameterIiv(texture_2D, pname_invalid, storei);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glGetTextureParameterIiv", "pname is not an accepted value.");

		gl.getTextureParameterIuiv(texture_2D, pname_invalid, storeu);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glGetTextureParameterIuiv",
								  "pname is not an accepted value.");

		gl.getTextureParameteriv(texture_2D, pname_invalid, storei);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glGetTextureParameteriv", "pname is not an accepted value.");

		/* Check that INVALID_OPERATION is generated by glGetTextureParameter* if
		 texture is not the name of an existing texture object. */
		gl.getTextureParameterfv(texture_invalid, GL_TEXTURE_TARGET, storef);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureParameterfv",
								  "texture is not the name of an existing texture object.");

		gl.getTextureParameterIiv(texture_invalid, GL_TEXTURE_TARGET, storei);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureParameterIiv",
								  "texture is not the name of an existing texture object.");

		gl.getTextureParameterIuiv(texture_invalid, GL_TEXTURE_TARGET, storeu);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureParameterIuiv",
								  "texture is not the name of an existing texture object.");

		gl.getTextureParameteriv(texture_invalid, GL_TEXTURE_TARGET, storei);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureParameteriv",
								  "texture is not the name of an existing texture object.");

		/* Check that INVALID_ENUM error is generated if the effective target is
		 not one of the supported texture targets (eg. TEXTURE_BUFFER). */
		gl.getTextureParameterfv(texture_buffer, GL_TEXTURE_TARGET, storef);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glGetTextureParameterfv",
							 "the effective target is not one of the supported texture targets (eg. TEXTURE_BUFFER).");

		gl.getTextureParameterIiv(texture_buffer, GL_TEXTURE_TARGET, storei);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glGetTextureParameterIiv",
							 "the effective target is not one of the supported texture targets (eg. TEXTURE_BUFFER).");

		gl.getTextureParameterIuiv(texture_buffer, GL_TEXTURE_TARGET, storeu);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glGetTextureParameterIuiv",
							 "the effective target is not one of the supported texture targets (eg. TEXTURE_BUFFER).");

		gl.getTextureParameteriv(texture_buffer, GL_TEXTURE_TARGET, storei);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glGetTextureParameteriv",
							 "the effective target is not one of the supported texture targets (eg. TEXTURE_BUFFER).");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (texture_2D)
	{
		gl.deleteTextures(1, &texture_2D);
	}

	if (texture_buffer)
	{
		gl.deleteTextures(1, &texture_buffer);
	}

	while (GL_NO_ERROR != gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}